

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

uint * __thiscall
Hpipe::Vec<unsigned_int>::push_back_unique<unsigned_int_const&>(Vec<unsigned_int> *this,uint *val)

{
  pointer puVar1;
  iterator __position;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__position._M_current - (long)puVar1 != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      if (puVar1[uVar4] == *val) {
        return puVar1 + uVar4;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)__position._M_current - (long)puVar1 >> 2));
  }
  if (__position._M_current ==
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,val);
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = *val;
    puVar2 = __position._M_current + 1;
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  return puVar2 + -1;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }